

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v6::internal::format_uint<1u,wchar_t,unsigned__int128>
                    (wchar_t *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  int in_ECX;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  uint digit;
  char *digits;
  wchar_t *end;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  wchar_t *buffer_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000034,num_digits);
  value_local._8_8_ = CONCAT71(in_register_00000011,upper);
  buffer_local = buffer + in_ECX;
  do {
    buffer_local[-1] = (int)(char)(((byte)(ulong)value_local & 1) + 0x30);
    value_local._0_8_ = value_local._8_8_ << 0x3f | (ulong)value_local >> 1;
    value_local._8_8_ = value_local._8_8_ >> 1;
    buffer_local = buffer_local + -1;
  } while ((ulong)value_local != 0 || value_local._8_8_ != 0);
  return buffer + in_ECX;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}